

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerElementUndefinedScoped(Lowerer *this,Instr *instr,JnHelperMethod helper)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  Opnd *pOVar4;
  SymOpnd *pSVar5;
  undefined4 *puVar6;
  Opnd *dst;
  Opnd *src;
  Instr *instrPrev;
  JnHelperMethod helper_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  pOVar4 = IR::Instr::UnlinkSrc1(instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar4);
  pOVar4 = IR::Instr::UnlinkDst(instr);
  bVar3 = IR::Opnd::IsSymOpnd(pOVar4);
  if (bVar3) {
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
    bVar3 = Sym::IsPropertySym(pSVar5->m_sym);
    if (bVar3) goto LAB_007ae096;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x2abe,"(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected fieldSym as dst of Ld Undefined Scoped");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_007ae096:
  LoadPropertySymAsArgument(this,instr,pOVar4);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr,helper,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerElementUndefinedScoped(IR::Instr * instr, IR::JnHelperMethod helper)
{
    IR::Instr * instrPrev = instr->m_prev;

    // Pass the default instance
    IR::Opnd *src = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, src);

    // Pass the property sym to store to
    IR::Opnd * dst = instr->UnlinkDst();
    AssertMsg(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected fieldSym as dst of Ld Undefined Scoped");

    this->LoadPropertySymAsArgument(instr, dst);

    m_lowererMD.ChangeToHelperCall(instr, helper);

    return instrPrev;
}